

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O0

void * mspace_memalign(mspace msp,size_t alignment,size_t bytes)

{
  mstate ms;
  size_t bytes_local;
  size_t alignment_local;
  mspace msp_local;
  
  if (alignment < 0x11) {
    msp_local = mspace_malloc(msp,bytes);
  }
  else {
    msp_local = internal_memalign((mstate)msp,alignment,bytes);
  }
  return msp_local;
}

Assistant:

void* mspace_memalign(mspace msp, size_t alignment, size_t bytes) {
  mstate ms = (mstate)msp;
  if (!ok_magic(ms)) {
    USAGE_ERROR_ACTION(ms,ms);
    return 0;
  }
  if (alignment <= MALLOC_ALIGNMENT)
    return mspace_malloc(msp, bytes);
  return internal_memalign(ms, alignment, bytes);
}